

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall
ON_Brep::IsValidEdgeTolerancesAndFlags(ON_Brep *this,int edge_index,ON_TextLog *text_log)

{
  int iVar1;
  uint uVar2;
  ON_BrepEdge *pOVar3;
  ON_BrepEdge *edge;
  ON_TextLog *text_log_local;
  int edge_index_local;
  ON_Brep *this_local;
  
  if ((edge_index < 0) ||
     (iVar1 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E),
     iVar1 <= edge_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      uVar2 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
      ON_TextLog::Print(text_log,"brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n"
                        ,(ulong)(uint)edge_index,(ulong)uVar2);
    }
    return false;
  }
  pOVar3 = ON_ClassArray<ON_BrepEdge>::operator[]
                     ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,edge_index);
  if (pOVar3->m_edge_index != edge_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"edge.m_edge_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar3->m_edge_index,(ulong)(uint)edge_index);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  if (pOVar3->m_tolerance <= 0.0 && pOVar3->m_tolerance != 0.0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"edge.m_tolerance=%g (should be >= 0.0)\n",pOVar3->m_tolerance);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  return true;
}

Assistant:

bool
ON_Brep::IsValidEdgeTolerancesAndFlags( int edge_index, ON_TextLog* text_log ) const
{
  if ( edge_index < 0 || edge_index >= m_E.Count() )
  {
    if ( text_log )
      text_log->Print("brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n",
                      edge_index, m_E.Count());
    return false;
  }
  const ON_BrepEdge& edge = m_E[edge_index];
  if ( edge.m_edge_index != edge_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_edge_index = %d (should be %d).\n",
                       edge.m_edge_index, edge_index );
      text_log->PopIndent();
    }
    return false;
  }

  if ( edge.m_tolerance < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_tolerance=%g (should be >= 0.0)\n",edge.m_tolerance);
      text_log->PopIndent();
    }
    return false;
  }

  return true;
}